

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb99.c
# Opt level: O0

err_t stb99RiVal(stb99_seed *seed,size_t r)

{
  bool bVar1;
  size_t i;
  size_t r_local;
  stb99_seed *seed_local;
  
  if (seed->ri[0] == r) {
    i = 1;
    while( true ) {
      bVar1 = false;
      if (i < 10) {
        bVar1 = 0x10 < seed->ri[i];
      }
      if (!bVar1) {
        if (0x20 < seed->ri[i - 1]) {
          return 0x20c;
        }
        while( true ) {
          if (9 < i) {
            return 0;
          }
          if (seed->ri[i] != 0) break;
          i = i + 1;
        }
        return 0x20c;
      }
      if (((0x3333333333333332 < seed->ri[i]) || (seed->ri[i] * 2 < seed->ri[i - 1])) ||
         (seed->ri[i - 1] * 4 - 0x10 <= seed->ri[i] * 5)) break;
      i = i + 1;
    }
  }
  return 0x20c;
}

Assistant:

static err_t stb99RiVal(const stb99_seed* seed, size_t r)
{
	size_t i;
	// проверить ri[0]
	if (seed->ri[0] != r)
		return ERR_BAD_SEED;
	ASSERT(seed->ri[0] > 16);
	// проверить цепочку ri
	for (i = 1; i < COUNT_OF(seed->ri) && seed->ri[i] > 16; ++i)
		if (seed->ri[i] >= SIZE_MAX / 5 ||
			seed->ri[i - 1] > 2 * seed->ri[i] ||
			5 * seed->ri[i] >= 4 * seed->ri[i - 1] - 16)
			return ERR_BAD_SEED;
	if (seed->ri[i - 1] > 32)
		return ERR_BAD_SEED;
	for (; i < COUNT_OF(seed->ri); ++i)
		if (seed->ri[i] != 0)
			return ERR_BAD_SEED;
	// все хорошо
	return ERR_OK;
}